

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O1

void __thiscall RenX_ModSystemPlugin::~RenX_ModSystemPlugin(RenX_ModSystemPlugin *this)

{
  list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  pointer pcVar4;
  undefined4 uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  
  *(undefined ***)this = &PTR_think_00117428;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00117908;
  uVar6 = RenX::getCore();
  lVar7 = RenX::Core::getServerCount();
  do {
    do {
      if (lVar7 == 0) {
        this_00 = &this->groups;
        std::__cxx11::
        _List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ::_M_clear(&this_00->
                    super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                  );
        (this->groups).
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
        (this->groups).
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
        (this->groups).
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node._M_size = 0;
        pcVar4 = (this->m_administratorGroup)._M_dataplus._M_p;
        paVar1 = &(this->m_administratorGroup).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        pcVar4 = (this->m_moderatorGroup)._M_dataplus._M_p;
        paVar1 = &(this->m_moderatorGroup).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        pcVar4 = (this->m_atmDefault)._M_dataplus._M_p;
        paVar1 = &(this->m_atmDefault).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        std::__cxx11::
        _List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ::_M_clear(&this_00->
                    super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                  );
        RenX::Plugin::~Plugin(&this->super_Plugin);
        return;
      }
      lVar7 = lVar7 + -1;
      lVar8 = RenX::Core::getServer(uVar6);
      lVar2 = *(long *)(lVar8 + 0x20);
      lVar9 = RenX::Server::getBotCount();
    } while (lVar2 == lVar9);
    for (puVar11 = *(undefined8 **)(lVar8 + 0x10); puVar11 != (undefined8 *)(lVar8 + 0x10);
        puVar11 = (undefined8 *)*puVar11) {
      if (*(char *)(puVar11 + 0x22) == '\0') {
        uVar10 = Jupiter::Config::operator[]
                           (puVar11 + 0x39,*(undefined8 *)&this->field_0x20,
                            *(undefined8 *)&this->field_0x18);
        Jupiter::Config::remove(uVar10,5,"Group");
        puVar11[0x31] = 0;
        *(undefined1 *)puVar11[0x30] = 0;
        puVar11[0x35] = 0;
        *(undefined1 *)puVar11[0x34] = 0;
        plVar3 = (long *)puVar11[0xb];
        if (puVar11[0xc] == 9) {
          if ((char)plVar3[1] != 'r' || *plVar3 != 0x6f74617265646f6d) goto LAB_0010e74a;
          uVar5 = 1;
        }
        else if ((puVar11[0xc] == 0xd) &&
                (*(long *)((long)plVar3 + 5) == 0x726f746172747369 && *plVar3 == 0x7473696e696d6461)
                ) {
          uVar5 = 2;
        }
        else {
LAB_0010e74a:
          uVar5 = 0;
        }
        *(undefined4 *)(puVar11 + 0x38) = uVar5;
      }
    }
  } while( true );
}

Assistant:

RenX_ModSystemPlugin::~RenX_ModSystemPlugin() {
	RenX::Core *core = RenX::getCore();
	size_t server_count = core->getServerCount();
	RenX::Server *server;
	while (server_count != 0) {
		server = core->getServer(--server_count);
		if (server->players.size() != server->getBotCount()) {
			for (auto node = server->players.begin(); node != server->players.end(); ++node) {
				if (node->isBot == false) {
					node->varData[RenX_ModSystemPlugin::name].remove("Group"sv);
					node->gamePrefix.clear();
					node->formatNamePrefix.clear();
					if (node->adminType == game_administrator_name)
						node->access = 2;
					else if (node->adminType == game_moderator_name)
						node->access = 1;
					else
						node->access = 0;
				}
			}
		}
	}

	RenX_ModSystemPlugin::groups.clear();
}